

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

uint32_t __thiscall libtorrent::aux::torrent::tracker_key(torrent *this)

{
  uint uVar1;
  hasher *phVar2;
  uchar *ptr;
  uintptr_t ses;
  uintptr_t self;
  uint32_t storage;
  sha1_hash h;
  
  ses = (uintptr_t)(this->super_torrent_hot_members).m_ses;
  storage = 0;
  if ((this->m_storage).m_disk_io != (disk_interface *)0x0) {
    storage = (this->m_storage).m_idx.m_val;
  }
  self = (uintptr_t)this;
  lcrypto::hasher::hasher((hasher *)&ptr,(char *)&self,8);
  phVar2 = lcrypto::hasher::update((hasher *)&ptr,(char *)&storage,4);
  phVar2 = lcrypto::hasher::update(phVar2,(char *)&ses,8);
  lcrypto::hasher::final(&h,phVar2);
  lcrypto::hasher::~hasher((hasher *)&ptr);
  ptr = (uchar *)&h;
  uVar1 = read_impl<unsigned_int,unsigned_char_const*>(&ptr);
  return uVar1;
}

Assistant:

std::uint32_t torrent::tracker_key() const
	{
		auto const self = reinterpret_cast<uintptr_t>(this);
		auto const ses = reinterpret_cast<uintptr_t>(&m_ses);
		std::uint32_t const storage = m_storage
			? static_cast<std::uint32_t>(static_cast<storage_index_t>(m_storage))
			: 0;
		sha1_hash const h = hasher(reinterpret_cast<char const*>(&self), sizeof(self))
			.update(reinterpret_cast<char const*>(&storage), sizeof(storage))
			.update(reinterpret_cast<char const*>(&ses), sizeof(ses))
			.final();
		unsigned char const* ptr = &h[0];
		return aux::read_uint32(ptr);
	}